

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdio.cpp
# Opt level: O2

SQRESULT sqstd_loadfile(HSQUIRRELVM v,SQChar *filename,SQBool printerror)

{
  FILE *__stream;
  SQUnsignedInteger size;
  SQAllocContext pSVar1;
  SQChar *s;
  size_t size_00;
  SQRESULT SVar2;
  
  __stream = fopen(filename,"rb");
  if (__stream != (FILE *)0x0) {
    sqstd_fseek(__stream,0,2);
    size = sqstd_fseek(__stream,0,1);
    pSVar1 = sq_getallocctx(v);
    s = (SQChar *)sq_malloc(pSVar1,size);
    sqstd_fseek(__stream,0,2);
    size_00 = fread(s,1,size,__stream);
    SVar2 = sq_compile(v,s,size_00,filename,printerror,(HSQOBJECT *)0x0);
    pSVar1 = sq_getallocctx(v);
    sq_free(pSVar1,s,size_00);
    sqstd_fclose(__stream);
    return SVar2 >> 0x3f;
  }
  SVar2 = sq_throwerror(v,"cannot open the file");
  return SVar2;
}

Assistant:

SQRESULT sqstd_loadfile(HSQUIRRELVM v,const SQChar *filename,SQBool printerror)
{
    SQFILE file = sqstd_fopen(filename,_SC("rb"));

    if(file){
        SQInteger size = 0;
        SQChar *buffer = readFileData(v, file, size);
        SQRESULT r = SQ_ERROR;

        if(SQ_SUCCEEDED(sq_compile(v,buffer,size,filename,printerror))){
            r = SQ_OK;
        }
        sq_free(sq_getallocctx(v), buffer, size);
        sqstd_fclose(file);
        return r;
    }
    return sq_throwerror(v,_SC("cannot open the file"));
}